

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

size_t mpack_node_copy_utf8(mpack_node_t node,char *buffer,size_t bufsize)

{
  char *pcVar1;
  mpack_node_data_t *pmVar2;
  _Bool _Var3;
  mpack_tree_error_t p_Var4;
  mpack_error_t mVar5;
  mpack_tree_t *pmVar6;
  mpack_node_data_t *pmVar7;
  ulong count;
  
  pmVar6 = node.tree;
  pmVar7 = node.data;
  if (pmVar6->error != mpack_ok) {
    return 0;
  }
  if (pmVar7->type == mpack_type_str) {
    count = (ulong)pmVar7->len;
    if (bufsize < count) {
      pmVar6->error = mpack_error_too_big;
      p_Var4 = pmVar6->error_fn;
      if (p_Var4 == (mpack_tree_error_t)0x0) {
        return 0;
      }
      mVar5 = mpack_error_too_big;
      goto LAB_00109d23;
    }
    pcVar1 = pmVar6->data;
    pmVar2 = (pmVar7->value).children;
    _Var3 = mpack_utf8_check_impl((uint8_t *)(pcVar1 + (long)pmVar2),count,true);
    if (_Var3) {
      memcpy(buffer,pcVar1 + (long)pmVar2,count);
      return (ulong)pmVar7->len;
    }
  }
  pmVar6->error = mpack_error_type;
  p_Var4 = pmVar6->error_fn;
  if (p_Var4 == (mpack_tree_error_t)0x0) {
    return 0;
  }
  mVar5 = mpack_error_type;
LAB_00109d23:
  (*p_Var4)(pmVar6,mVar5);
  return 0;
}

Assistant:

size_t mpack_node_copy_utf8(mpack_node_t node, char* buffer, size_t bufsize) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    mpack_assert(bufsize == 0 || buffer != NULL, "buffer is NULL for maximum of %i bytes", (int)bufsize);

    mpack_type_t type = node.data->type;
    if (type != mpack_type_str) {
        mpack_node_flag_error(node, mpack_error_type);
        return 0;
    }

    if (node.data->len > bufsize) {
        mpack_node_flag_error(node, mpack_error_too_big);
        return 0;
    }

    if (!mpack_utf8_check(mpack_node_data_unchecked(node), node.data->len)) {
        mpack_node_flag_error(node, mpack_error_type);
        return 0;
    }

    mpack_memcpy(buffer, mpack_node_data_unchecked(node), node.data->len);
    return (size_t)node.data->len;
}